

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyTable.cpp
# Opt level: O0

WebAssemblyTable *
Js::WebAssemblyTable::Create(uint32 initial,uint32 maximum,ScriptContext *scriptContext)

{
  WriteBarrierPtr<void> *values_00;
  uint uVar1;
  uint32 currentLength;
  uint32 uVar2;
  Recycler *pRVar3;
  WebAssemblyTable *this;
  JavascriptLibrary *this_00;
  DynamicType *type;
  TrackAllocData local_80;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  WriteBarrierPtr<void> *local_20;
  Type *values;
  ScriptContext *scriptContext_local;
  uint32 maximum_local;
  uint32 initial_local;
  
  values = (Type *)scriptContext;
  scriptContext_local._0_4_ = maximum;
  scriptContext_local._4_4_ = initial;
  if (initial <= maximum) {
    uVar2 = Wasm::Limits::GetMaxTableSize();
    uVar1 = (uint32)scriptContext_local;
    if (initial <= uVar2) {
      uVar2 = Wasm::Limits::GetMaxTableSize();
      if (uVar1 <= uVar2) {
        local_20 = (WriteBarrierPtr<void> *)0x0;
        if (scriptContext_local._4_4_ != 0) {
          pRVar3 = ScriptContext::GetRecycler((ScriptContext *)values);
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_48,(type_info *)&Memory::WriteBarrierPtr<void>::typeinfo,0,
                     (ulong)scriptContext_local._4_4_,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                     ,0xd1);
          pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_48);
          local_58 = Memory::Recycler::AllocZero;
          local_50 = 0;
          local_20 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                               ((Memory *)pRVar3,(Recycler *)Memory::Recycler::AllocZero,0,
                                (ulong)scriptContext_local._4_4_);
        }
        pRVar3 = ScriptContext::GetRecycler((ScriptContext *)values);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_80,(type_info *)&typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                   ,0xd3);
        pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_80);
        this = (WebAssemblyTable *)new<Memory::Recycler>(0x38,pRVar3,0x43c4b0);
        currentLength = scriptContext_local._4_4_;
        uVar2 = (uint32)scriptContext_local;
        values_00 = local_20;
        this_00 = ScriptContext::GetLibrary((ScriptContext *)values);
        type = JavascriptLibrary::GetWebAssemblyTableType(this_00);
        WebAssemblyTable(this,values_00,currentLength,currentLength,uVar2,type);
        return this;
      }
    }
  }
  JavascriptError::ThrowRangeError((ScriptContext *)values,-0x7ff5ebf6,(PCWSTR)0x0);
}

Assistant:

WebAssemblyTable *
WebAssemblyTable::Create(uint32 initial, uint32 maximum, ScriptContext * scriptContext)
{
    if (initial > maximum || initial > Wasm::Limits::GetMaxTableSize() || maximum > Wasm::Limits::GetMaxTableSize())
    {
        JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange);
    }
    Field(Var) * values = nullptr;
    if (initial > 0)
    {
        values = RecyclerNewArrayZ(scriptContext->GetRecycler(), Field(Var), initial);
    }
    return RecyclerNew(scriptContext->GetRecycler(), WebAssemblyTable, values, initial, initial, maximum, scriptContext->GetLibrary()->GetWebAssemblyTableType());
}